

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTests.cpp
# Opt level: O2

void __thiscall ParserTest_Factor_Test::TestBody(ParserTest_Factor_Test *this)

{
  _Head_base<0UL,_NumericLiteralNode_*,_false> _Var1;
  _Alloc_hider _Var2;
  pointer *__ptr;
  BinaryOperator BVar3;
  _Head_base<0UL,_VariableNode_*,_false> local_128;
  _Head_base<0UL,_NumericLiteralNode_*,_false> local_120;
  BinaryOperator local_118;
  undefined4 uStack_114;
  unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> local_110;
  undefined1 local_104 [8];
  undefined4 uStack_fc;
  string local_f8;
  undefined1 local_d4 [4];
  __uniq_ptr_impl<Node,_std::default_delete<Node>_> local_d0;
  __uniq_ptr_impl<Node,_std::default_delete<Node>_> local_c8;
  BinaryOperator local_bc;
  _Head_base<0UL,_Node_*,_false> local_b8;
  _Head_base<0UL,_Node_*,_false> local_b0;
  code *local_a8 [2];
  code *local_98;
  code *local_90;
  code *local_88 [2];
  code *local_78;
  code *local_70;
  code *local_68 [2];
  code *local_58;
  code *local_50;
  code *local_48 [2];
  code *local_38;
  code *local_30;
  
  BVar3 = Multiplication;
  local_118 = BVar3;
  std::make_unique<NumericLiteralNode,int>((int *)&local_f8);
  local_104._4_4_ = 3;
  local_110._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  ._M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_ = BVar3;
  std::make_unique<NumericLiteralNode,int>((int *)&local_128);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_120,
             (BinaryOperator *)&local_f8,&local_110);
  if (local_128._M_head_impl != (VariableNode *)0x0) {
    (*((local_128._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  if ((long *)local_f8._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"2 * 3",(allocator<char> *)&local_128);
  _Var1._M_head_impl = local_120._M_head_impl;
  local_48[0] = Parser::parseFactor;
  local_48[1] = (code *)0x0;
  local_30 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_120._M_head_impl = (NumericLiteralNode *)0x0;
  local_38 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_c8._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (tuple<Node_*,_std::default_delete<Node>_>)_Var1._M_head_impl;
  setupTest(&local_f8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_48,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_c8);
  if (_Var1._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])(_Var1._M_head_impl);
  }
  local_c8._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (_Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>)0x0;
  std::_Function_base::~_Function_base((_Function_base *)local_48);
  std::__cxx11::string::~string((string *)&local_f8);
  local_110._M_t.super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
  ._M_t.super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>.
  super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._0_4_ = 5;
  std::make_unique<NumericLiteralNode,int>((int *)&local_128);
  local_104._0_4_ = 3;
  local_104._4_4_ = local_104._0_4_;
  std::make_unique<NumericLiteralNode,int>((int *)&local_118);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)&local_f8,
             (BinaryOperator *)&local_128,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)
             (local_104 + 4));
  _Var2._M_p = local_f8._M_dataplus._M_p;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_120._M_head_impl = (NumericLiteralNode *)_Var2._M_p;
  if (_Var1._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
    if ((long *)local_f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
    }
  }
  local_f8._M_dataplus._M_p = (pointer)0x0;
  if ((long *)CONCAT44(uStack_114,local_118) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_114,local_118) + 8))();
  }
  if (local_128._M_head_impl != (VariableNode *)0x0) {
    (*((local_128._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"5 / 3",(allocator<char> *)&local_128);
  _Var1._M_head_impl = local_120._M_head_impl;
  local_68[0] = Parser::parseFactor;
  local_68[1] = (code *)0x0;
  local_120._M_head_impl = (NumericLiteralNode *)0x0;
  local_50 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_d0._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (tuple<Node_*,_std::default_delete<Node>_>)_Var1._M_head_impl;
  setupTest(&local_f8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_68,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_d0);
  if (_Var1._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])(_Var1._M_head_impl);
  }
  local_d0._M_t.super__Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>.
  super__Head_base<0UL,_Node_*,_false>._M_head_impl =
       (tuple<Node_*,_std::default_delete<Node>_>)
       (_Tuple_impl<0UL,_Node_*,_std::default_delete<Node>_>)0x0;
  std::_Function_base::~_Function_base((_Function_base *)local_68);
  std::__cxx11::string::~string((string *)&local_f8);
  local_104._4_4_ = 1;
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])&local_118);
  std::
  make_unique<UnaryNode,UnaryOperator,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>>
            ((UnaryOperator *)&local_128,
             (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)(local_104 + 4));
  local_104._0_4_ = BVar3;
  local_d4 = (undefined1  [4])BVar3;
  std::make_unique<NumericLiteralNode,int>((int *)&local_110);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<UnaryNode,std::default_delete<UnaryNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<UnaryNode,_std::default_delete<UnaryNode>_> *)&local_f8,
             (BinaryOperator *)&local_128,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)local_104);
  _Var2._M_p = local_f8._M_dataplus._M_p;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_120._M_head_impl = (NumericLiteralNode *)_Var2._M_p;
  if (_Var1._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
    if ((long *)local_f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
    }
  }
  local_f8._M_dataplus._M_p = (pointer)0x0;
  if ((long *)CONCAT44(local_110._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._4_4_,
                       (BinaryOperator)
                       local_110._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_110._M_t.
                                   super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                   .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl.
                                   _4_4_,(BinaryOperator)
                                         local_110._M_t.
                                         super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                         .super__Head_base<0UL,_NumericLiteralNode_*,_false>.
                                         _M_head_impl) + 8))();
  }
  if (local_128._M_head_impl != (VariableNode *)0x0) {
    (*((local_128._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_128._M_head_impl = (VariableNode *)0x0;
  if ((long *)CONCAT44(uStack_114,local_118) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_114,local_118) + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"-x * 2",(allocator<char> *)&local_128);
  _Var1._M_head_impl = local_120._M_head_impl;
  local_88[0] = Parser::parseFactor;
  local_88[1] = (code *)0x0;
  local_120._M_head_impl = (NumericLiteralNode *)0x0;
  local_70 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_78 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_b0._M_head_impl = (Node *)_Var1._M_head_impl;
  setupTest(&local_f8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_88,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_b0);
  if (_Var1._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])(_Var1._M_head_impl);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_88);
  std::__cxx11::string::~string((string *)&local_f8);
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])&local_118);
  local_104._0_4_ = 3;
  std::make_unique<VariableNode,char_const(&)[2]>((char (*) [2])&local_110);
  std::
  make_unique<BinaryOpNode,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>,BinaryOperator,std::unique_ptr<VariableNode,std::default_delete<VariableNode>>>
            ((unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)&local_128,&local_118,
             (unique_ptr<VariableNode,_std::default_delete<VariableNode>_> *)local_104);
  local_d4 = (undefined1  [4])BVar3;
  local_bc = BVar3;
  std::make_unique<NumericLiteralNode,int>((int *)(local_104 + 4));
  std::
  make_unique<BinaryOpNode,std::unique_ptr<BinaryOpNode,std::default_delete<BinaryOpNode>>,BinaryOperator,std::unique_ptr<NumericLiteralNode,std::default_delete<NumericLiteralNode>>>
            ((unique_ptr<BinaryOpNode,_std::default_delete<BinaryOpNode>_> *)&local_f8,
             (BinaryOperator *)&local_128,
             (unique_ptr<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_> *)local_d4);
  _Var2._M_p = local_f8._M_dataplus._M_p;
  _Var1._M_head_impl = local_120._M_head_impl;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_120._M_head_impl = (NumericLiteralNode *)_Var2._M_p;
  if (_Var1._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
    if ((long *)local_f8._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_f8._M_dataplus._M_p + 8))();
    }
  }
  local_f8._M_dataplus._M_p = (pointer)0x0;
  if ((long *)CONCAT44(uStack_fc,local_104._4_4_) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_fc,local_104._4_4_) + 8))();
  }
  if (local_128._M_head_impl != (VariableNode *)0x0) {
    (*((local_128._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  local_128._M_head_impl = (VariableNode *)0x0;
  if ((long *)CONCAT44(local_110._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl._4_4_,
                       (BinaryOperator)
                       local_110._M_t.
                       super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                       .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl) !=
      (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_110._M_t.
                                   super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                   .super__Head_base<0UL,_NumericLiteralNode_*,_false>._M_head_impl.
                                   _4_4_,(BinaryOperator)
                                         local_110._M_t.
                                         super___uniq_ptr_impl<NumericLiteralNode,_std::default_delete<NumericLiteralNode>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_NumericLiteralNode_*,_std::default_delete<NumericLiteralNode>_>
                                         .super__Head_base<0UL,_NumericLiteralNode_*,_false>.
                                         _M_head_impl) + 8))();
  }
  if ((long *)CONCAT44(uStack_114,local_118) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(uStack_114,local_118) + 8))();
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"y / x * 2",(allocator<char> *)&local_128);
  _Var1._M_head_impl = local_120._M_head_impl;
  local_a8[0] = Parser::parseFactor;
  local_a8[1] = (code *)0x0;
  local_120._M_head_impl = (NumericLiteralNode *)0x0;
  local_90 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_invoke;
  local_98 = std::
             _Function_handler<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*),_std::unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_>_(Parser::*)()>
             ::_M_manager;
  local_b8._M_head_impl = (Node *)_Var1._M_head_impl;
  setupTest(&local_f8,
            (function<std::unique_ptr<Node,_std::default_delete<Node>_>_(Parser_*)> *)local_a8,
            (unique_ptr<Node,_std::default_delete<Node>_> *)&local_b8);
  if (_Var1._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((_Var1._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])(_Var1._M_head_impl);
  }
  std::_Function_base::~_Function_base((_Function_base *)local_a8);
  std::__cxx11::string::~string((string *)&local_f8);
  if (local_120._M_head_impl != (NumericLiteralNode *)0x0) {
    (*((local_120._M_head_impl)->super_ExpressionNode).super_Node._vptr_Node[1])();
  }
  return;
}

Assistant:

TEST(ParserTest, Factor)
{
  auto node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(2), 
      BinaryOperator::Multiplication, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("2 * 3", &Parser::parseFactor, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<NumericLiteralNode>(5), 
      BinaryOperator::Division, 
      std::make_unique<NumericLiteralNode>(3));
  setupTest("5 / 3", &Parser::parseFactor, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<UnaryNode>(UnaryOperator::Minus, std::make_unique<VariableNode>("x")), 
      BinaryOperator::Multiplication, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("-x * 2", &Parser::parseFactor, std::move(node));

  node = std::make_unique<BinaryOpNode>(
      std::make_unique<BinaryOpNode>(std::make_unique<VariableNode>("y"), BinaryOperator::Division, std::make_unique<VariableNode>("x")), 
      BinaryOperator::Multiplication, 
      std::make_unique<NumericLiteralNode>(2));
  setupTest("y / x * 2", &Parser::parseFactor, std::move(node));
}